

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_redo(nk_text_edit *state)

{
  undefined8 uVar1;
  nk_rune nVar2;
  undefined8 *puVar3;
  nk_str *in_RDI;
  int i;
  nk_text_undo_record r;
  nk_text_undo_record *u;
  nk_text_undo_state *s;
  int local_28;
  nk_rune pos;
  short sVar4;
  short sVar5;
  int len;
  nk_rune *runes;
  nk_memory *pnVar6;
  
  pnVar6 = &in_RDI[1].buffer.memory;
  if (*(short *)((long)&in_RDI[0x2a].buffer.marker[0].active + 2) != 99) {
    runes = (nk_rune *)
            ((long)&pnVar6->ptr + (long)(short)in_RDI[0x2a].buffer.marker[0].active * 0xc);
    puVar3 = (undefined8 *)
             ((long)&pnVar6->ptr +
             (long)*(short *)((long)&in_RDI[0x2a].buffer.marker[0].active + 2) * 0xc);
    uVar1 = *puVar3;
    pos = (nk_rune)uVar1;
    sVar4 = (short)((ulong)uVar1 >> 0x20);
    sVar5 = (short)((ulong)uVar1 >> 0x30);
    len = *(int *)(puVar3 + 1);
    *(short *)((long)runes + 6) = sVar4;
    *(short *)(runes + 1) = sVar5;
    *runes = pos;
    *(undefined2 *)(runes + 2) = 0xffff;
    if (sVar5 != 0) {
      if ((int)*(short *)&in_RDI[0x2a].buffer.marker[0].field_0x6 <
          (int)*(short *)&in_RDI[0x2a].buffer.marker[0].field_0x4 + (int)(short)runes[1]) {
        *(undefined2 *)(runes + 1) = 0;
        *(undefined2 *)((long)runes + 6) = 0;
      }
      else {
        *(undefined2 *)(runes + 2) = *(undefined2 *)&in_RDI[0x2a].buffer.marker[0].field_0x4;
        *(short *)&in_RDI[0x2a].buffer.marker[0].field_0x4 =
             *(short *)&in_RDI[0x2a].buffer.marker[0].field_0x4 + (short)runes[1];
        for (local_28 = 0; local_28 < (short)runes[1]; local_28 = local_28 + 1) {
          nVar2 = nk_str_rune_at((nk_str *)CONCAT44(len,CONCAT22(sVar5,sVar4)),pos);
          *(nk_rune *)((long)(pnVar6 + 0x4a) + 4 + (long)((short)runes[2] + local_28) * 4) = nVar2;
        }
      }
      nk_str_delete_runes((nk_str *)u,r._8_4_,r._4_4_);
    }
    if (sVar4 != 0) {
      nk_str_insert_text_runes(in_RDI,(int)((ulong)pnVar6 >> 0x20),runes,len);
    }
    *(nk_rune *)&in_RDI[1].buffer.pool.alloc = pos + (int)sVar4;
    *(short *)(pnVar6 + 0x144) = *(short *)(pnVar6 + 0x144) + 1;
    *(short *)((long)(pnVar6 + 0x144) + 2) = *(short *)((long)(pnVar6 + 0x144) + 2) + 1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_redo(struct nk_text_edit *state)
{
struct nk_text_undo_state *s = &state->undo;
struct nk_text_undo_record *u, r;
if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
return;

/* we need to do two things: apply the redo record, and create an undo record */
u = &s->undo_rec[s->undo_point];
r = s->undo_rec[s->redo_point];

/* we KNOW there must be room for the undo record, because the redo record
    was derived from an undo record */
u->delete_length = r.insert_length;
u->insert_length = r.delete_length;
u->where = r.where;
u->char_storage = -1;

if (r.delete_length) {
/* the redo record requires us to delete characters, so the undo record
        needs to store the characters */
if (s->undo_char_point + u->insert_length > s->redo_char_point) {
u->insert_length = 0;
u->delete_length = 0;
} else {
int i;
u->char_storage = s->undo_char_point;
s->undo_char_point = (short)(s->undo_char_point + u->insert_length);

/* now save the characters */
for (i=0; i < u->insert_length; ++i) {
s->undo_char[u->char_storage + i] =
nk_str_rune_at(&state->string, u->where + i);
}
}
nk_str_delete_runes(&state->string, r.where, r.delete_length);
}

if (r.insert_length) {
/* easy case: need to insert n characters */
nk_str_insert_text_runes(&state->string, r.where,
&s->undo_char[r.char_storage], r.insert_length);
}
state->cursor = r.where + r.insert_length;

s->undo_point++;
s->redo_point++;
}